

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

DdNode * Abc_ConvertAigToBdd(DdManager *dd,Hop_Obj_t *pRoot)

{
  void *pvVar1;
  int iVar2;
  Hop_Obj_t *pHVar3;
  DdNode *pDVar4;
  DdNode *bFunc;
  Hop_Obj_t *pRoot_local;
  DdManager *dd_local;
  
  pHVar3 = Hop_Regular(pRoot);
  iVar2 = Hop_ObjIsConst1(pHVar3);
  if (iVar2 == 0) {
    pHVar3 = Hop_Regular(pRoot);
    Abc_ConvertAigToBdd_rec1(dd,pHVar3);
    pHVar3 = Hop_Regular(pRoot);
    pvVar1 = (pHVar3->field_0).pData;
    iVar2 = Hop_IsComplement(pRoot);
    dd_local = (DdManager *)((ulong)pvVar1 ^ (long)iVar2);
    Cudd_Ref((DdNode *)dd_local);
    pHVar3 = Hop_Regular(pRoot);
    Abc_ConvertAigToBdd_rec2(dd,pHVar3);
    Cudd_Deref((DdNode *)dd_local);
  }
  else {
    pDVar4 = Cudd_ReadOne(dd);
    iVar2 = Hop_IsComplement(pRoot);
    dd_local = (DdManager *)((ulong)pDVar4 ^ (long)iVar2);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * Abc_ConvertAigToBdd( DdManager * dd, Hop_Obj_t * pRoot )
{
    DdNode * bFunc;
    // check the case of a constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return Cudd_NotCond( Cudd_ReadOne(dd), Hop_IsComplement(pRoot) );
    // construct BDD
    Abc_ConvertAigToBdd_rec1( dd, Hop_Regular(pRoot) );
    // hold on to the result
    bFunc = Cudd_NotCond( Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );  Cudd_Ref( bFunc );
    // dereference BDD
    Abc_ConvertAigToBdd_rec2( dd, Hop_Regular(pRoot) );
    // return the result
    Cudd_Deref( bFunc );
    return bFunc;
}